

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalTexture3DProjOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float *pfVar9;
  Vector<int,_3> local_54;
  undefined1 local_48 [16];
  Vector<float,_4> local_38;
  tcu local_28 [8];
  float local_20 [2];
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar9 = tcu::Vector<float,_4>::x(c->in);
  fVar1 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar2 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  fVar3 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar4 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  fVar5 = *pfVar9;
  pfVar9 = tcu::Vector<float,_4>::w((Vector<float,_4> *)(p_local + 1));
  fVar6 = *pfVar9;
  fVar7 = local_18->lod;
  pfVar9 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  fVar8 = *pfVar9;
  tcu::Vector<int,_3>::Vector(&local_54,&local_18->offset);
  texture3DOffset((ShaderEvalContext *)local_48,fVar1 / fVar2,fVar3 / fVar4,fVar5 / fVar6,
                  fVar7 + fVar8,(IVec3 *)c);
  tcu::operator*((tcu *)&local_38,(Vector<float,_4> *)local_48,&local_18->scale);
  tcu::operator+(local_28,&local_38,&local_18->bias);
  *(tcu (*) [8])p_local[0xc].scale.m_data = local_28;
  *(float (*) [2])(p_local[0xc].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture3DProjOffsetBias		(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), p.lod+c.in[1].x(), p.offset)*p.scale + p.bias; }